

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

int __thiscall gvr::PLYWriter::open(PLYWriter *this,char *__file,int __oflag,...)

{
  ofstream *poVar1;
  pointer ppPVar2;
  pointer ppPVar3;
  PLYElement *this_00;
  bool bVar4;
  char cVar5;
  int iVar6;
  size_t i;
  ulong uVar7;
  
  if (__oflag == 1) {
    bVar4 = gutil::isMSBFirst();
    __oflag = bVar4 ^ ply_little_endian;
  }
  this->enc = __oflag;
  uVar7 = 0;
  while( true ) {
    ppPVar2 = (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppPVar3 = (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppPVar3 - (long)ppPVar2 >> 3) <= uVar7) break;
    this_00 = ppPVar2[uVar7];
    if (this_00 != (PLYElement *)0x0) {
      PLYElement::~PLYElement(this_00);
    }
    operator_delete(this_00);
    uVar7 = uVar7 + 1;
  }
  if (ppPVar3 != ppPVar2) {
    (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppPVar2;
  }
  this->element = (PLYElement *)0x0;
  this->header_complete = false;
  poVar1 = &this->out;
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 != '\0') {
    std::ofstream::close();
  }
  std::ios::exceptions((int)*(undefined8 *)(*(long *)poVar1 + -0x18) + (int)poVar1);
  iVar6 = std::ofstream::open((char *)poVar1,(_Ios_Openmode)__file);
  return iVar6;
}

Assistant:

void PLYWriter::open(const char *name, ply_encoding encoding)
{
  // set encoding

  if (encoding == ply_binary)
  {
    if (gutil::isMSBFirst())
    {
      encoding=ply_big_endian;
    }
    else
    {
      encoding=ply_little_endian;
    }
  }

  enc=encoding;

  // empty list, close file (if necessary) and open new file

  for (size_t i=0; i<list.size(); i++)
  {
    delete list[i];
  }

  list.clear();
  element=0;

  header_complete=false;

  if (out.is_open())
  {
    out.close();
  }

  out.exceptions(std::ios_base::failbit | std::ios_base::badbit);
  out.open(name, std::ios_base::binary);
}